

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromDeviceAuth
          (char *iothub_uri,char *device_id,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  IOTHUB_CLIENT_CONFIG *client_config;
  char *pcVar1;
  char *__dest;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar3;
  int iVar4;
  ulong uVar5;
  ulong __n;
  size_t sVar6;
  size_t __n_00;
  
  if (((device_id == (char *)0x0) || (iothub_uri == (char *)0x0)) ||
     (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar1 = "Input parameter is NULL: iothub_uri: %p  protocol: %p device_id: %p";
    iVar4 = 0x508;
  }
  else {
    client_config = (IOTHUB_CLIENT_CONFIG *)calloc(1,0x38);
    if (client_config != (IOTHUB_CLIENT_CONFIG *)0x0) {
      client_config->protocol = protocol;
      client_config->deviceId = device_id;
      uVar5 = 0;
      do {
        if (iothub_uri[uVar5] == '.') {
          __n = uVar5;
          if (iothub_uri + uVar5 < iothub_uri) {
            __n = 0xffffffffffffffff;
          }
          sVar6 = __n + 1;
          if (sVar6 == 0) {
            sVar6 = 0xffffffffffffffff;
          }
          if ((sVar6 == 0xffffffffffffffff) ||
             (pcVar1 = (char *)calloc(1,sVar6), pcVar1 == (char *)0x0)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x540,1,
                        "Failed to allocate iothub name, size:%zu",sVar6);
            }
          }
          else {
            memcpy(pcVar1,iothub_uri,__n);
            client_config->iotHubName = pcVar1;
            sVar6 = strlen(iothub_uri);
            __n_00 = (__n ^ 0xffffffffffffffff) + sVar6;
            if (sVar6 < __n) {
              __n_00 = 0xfffffffffffffffe;
            }
            if (sVar6 == __n) {
              __n_00 = 0xffffffffffffffff;
            }
            sVar6 = 0xffffffffffffffff;
            if (__n_00 + 1 != 0) {
              sVar6 = __n_00 + 1;
            }
            if ((sVar6 != 0xffffffffffffffff) &&
               (__dest = (char *)calloc(1,sVar6), __dest != (char *)0x0)) {
              memcpy(__dest,iothub_uri + uVar5 + 1,__n_00);
              client_config->iotHubSuffix = __dest;
              pIVar3 = initialize_iothub_client
                                 (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,true,(char *)0x0)
              ;
              if (pIVar3 != (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) goto LAB_00120b32;
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00120b2f;
              pIVar3 = (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x551,1,
                        "initialize iothub client");
              goto LAB_00120b32;
            }
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x538,1,
                        "Failed to allocate iothub suffix, size:%zu",sVar6);
            }
            free(pcVar1);
          }
        }
        else if (iothub_uri[uVar5] == '\0') {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x549,1,"initialize iothub client"
                     );
          }
          pcVar1 = (char *)0x0;
          __dest = (char *)0x0;
LAB_00120b2f:
          pIVar3 = (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
LAB_00120b32:
          free(pcVar1);
          free(__dest);
          free(client_config);
          return pIVar3;
        }
        uVar5 = uVar5 + 1;
      } while( true );
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar1 = "Malloc failed";
    iVar4 = 0x511;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_CreateFromDeviceAuth",iVar4,1,pcVar1);
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromDeviceAuth(const char* iothub_uri, const char* device_id, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;
    if (iothub_uri == NULL || protocol == NULL || device_id == NULL)
    {
        LogError("Input parameter is NULL: iothub_uri: %p  protocol: %p device_id: %p", iothub_uri, protocol, device_id);
        result = NULL;
    }
    else
    {
#ifdef USE_PROV_MODULE
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*)malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            const char* iterator;
            const char* initial;
            char* iothub_name = NULL;
            char* iothub_suffix = NULL;

            memset(config, 0, sizeof(IOTHUB_CLIENT_CONFIG));
            config->protocol = protocol;
            config->deviceId = device_id;

            // Find the iothub suffix
            initial = iterator = iothub_uri;
            while (iterator != NULL && *iterator != '\0')
            {
                if (*iterator == '.')
                {
                    size_t length = safe_subtract_size_t(iterator, initial);
                    size_t calloc_size = safe_add_size_t(length, 1);
                    if (calloc_size != SIZE_MAX &&
                        (iothub_name = (char*)calloc(1, calloc_size)) != NULL)
                    {
                        memcpy(iothub_name, initial, length);
                        config->iotHubName = iothub_name;

                        length = safe_subtract_size_t(safe_subtract_size_t(strlen(initial), length), 1);
                        calloc_size = safe_add_size_t(length, 1);
                        if (calloc_size != SIZE_MAX &&
                            (iothub_suffix = (char*)calloc(1, calloc_size)) != NULL)
                        {
                            memcpy(iothub_suffix, iterator + 1, length);
                            config->iotHubSuffix = iothub_suffix;
                            break;
                        }
                        else
                        {
                            LogError("Failed to allocate iothub suffix, size:%zu", calloc_size);
                            free(iothub_name);
                            iothub_name = NULL;
                            result = NULL;
                        }
                    }
                    else
                    {
                        LogError("Failed to allocate iothub name, size:%zu", calloc_size);
                        result = NULL;
                    }
                }
                iterator++;
            }

            if (config->iotHubName == NULL || config->iotHubSuffix == NULL)
            {
                LogError("initialize iothub client");
                result = NULL;
            }
            else
            {
                IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = initialize_iothub_client(config, NULL, true, NULL);
                if (handleData == NULL)
                {
                    LogError("initialize iothub client");
                    result = NULL;
                }
                else
                {
                    result = handleData;
                }
            }

            free(iothub_name);
            free(iothub_suffix);
            free(config);
        }
#else
        LogError("HSM module is not included");
        result = NULL;
#endif
    }
    return result;
}